

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmMakefileTargetGenerator::CreateResponseFile
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this,char *name,string *options
          ,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *makefile_depends)

{
  ostream *poVar1;
  undefined1 local_2a8 [8];
  cmGeneratedFileStream responseStream;
  undefined1 local_50 [8];
  string responseFileNameFull;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *makefile_depends_local;
  string *options_local;
  char *name_local;
  cmMakefileTargetGenerator *this_local;
  string *responseFileName;
  
  responseFileNameFull.field_2._8_8_ = makefile_depends;
  std::__cxx11::string::string((string *)local_50,(string *)&this->TargetBuildDirectoryFull);
  std::__cxx11::string::operator+=((string *)local_50,"/");
  std::__cxx11::string::operator+=((string *)local_50,name);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_2a8,(string *)local_50,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_2a8,true);
  poVar1 = std::operator<<((ostream *)local_2a8,(string *)options);
  std::operator<<(poVar1,"\n");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)responseFileNameFull.field_2._8_8_,(value_type *)local_50);
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&this->TargetBuildDirectory);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,name);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2a8);
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefileTargetGenerator::CreateResponseFile(
  const char* name, std::string const& options,
  std::vector<std::string>& makefile_depends)
{
  // Create the response file.
  std::string responseFileNameFull = this->TargetBuildDirectoryFull;
  responseFileNameFull += "/";
  responseFileNameFull += name;
  cmGeneratedFileStream responseStream(responseFileNameFull);
  responseStream.SetCopyIfDifferent(true);
  responseStream << options << "\n";

  // Add a dependency so the target will rebuild when the set of
  // objects changes.
  makefile_depends.push_back(std::move(responseFileNameFull));

  // Construct the name to be used on the command line.
  std::string responseFileName = this->TargetBuildDirectory;
  responseFileName += "/";
  responseFileName += name;
  return responseFileName;
}